

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_DBOpen_Options::_Run(_Test_DBOpen_Options *this)

{
  DB DVar1;
  char *pcVar2;
  Status s;
  DB *db;
  string dbname;
  Options opts;
  DB local_260;
  DB *local_258;
  string local_250;
  Status local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  _func_int **local_208 [52];
  Options local_68;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(&local_228,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                 "/db_options_test");
  std::__cxx11::string::~string((string *)local_208);
  Options::Options((Options *)local_208);
  DestroyDB((leveldb *)&local_230,&local_228,(Options *)local_208);
  Status::~Status(&local_230);
  local_258 = (DB *)0x0;
  Options::Options(&local_68);
  local_68.create_if_missing = false;
  DB::Open(&local_260,&local_68,&local_228,&local_258);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x65a);
  Status::ToString_abi_cxx11_(&local_250,(Status *)&local_260);
  pcVar2 = strstr(local_250._M_dataplus._M_p,"does not exist");
  test::Tester::Is((Tester *)local_208,pcVar2 != (char *)0x0,
                   "strstr(s.ToString().c_str(), \"does not exist\") != nullptr");
  std::__cxx11::string::~string((string *)&local_250);
  test::Tester::~Tester((Tester *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x65b);
  test::Tester::Is((Tester *)local_208,local_258 == (DB *)0x0,"db == nullptr");
  test::Tester::~Tester((Tester *)local_208);
  local_68.create_if_missing = true;
  DB::Open((DB *)local_208,&local_68,&local_228,&local_258);
  DVar1._vptr_DB = local_260._vptr_DB;
  local_260._vptr_DB = local_208[0];
  local_208[0] = DVar1._vptr_DB;
  Status::~Status((Status *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x660);
  test::Tester::IsOk((Tester *)local_208,(Status *)&local_260);
  test::Tester::~Tester((Tester *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x661);
  test::Tester::Is((Tester *)local_208,local_258 != (DB *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)local_208);
  if (local_258 != (DB *)0x0) {
    (*local_258->_vptr_DB[1])();
  }
  local_258 = (DB *)0x0;
  local_68.create_if_missing = false;
  local_68.error_if_exists = true;
  DB::Open((DB *)local_208,&local_68,&local_228,&local_258);
  DVar1._vptr_DB = local_260._vptr_DB;
  local_260._vptr_DB = local_208[0];
  local_208[0] = DVar1._vptr_DB;
  Status::~Status((Status *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x66a);
  Status::ToString_abi_cxx11_(&local_250,(Status *)&local_260);
  pcVar2 = strstr(local_250._M_dataplus._M_p,"exists");
  test::Tester::Is((Tester *)local_208,pcVar2 != (char *)0x0,
                   "strstr(s.ToString().c_str(), \"exists\") != nullptr");
  std::__cxx11::string::~string((string *)&local_250);
  test::Tester::~Tester((Tester *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x66b);
  test::Tester::Is((Tester *)local_208,local_258 == (DB *)0x0,"db == nullptr");
  test::Tester::~Tester((Tester *)local_208);
  local_68.create_if_missing = true;
  local_68.error_if_exists = false;
  DB::Open((DB *)local_208,&local_68,&local_228,&local_258);
  DVar1._vptr_DB = local_260._vptr_DB;
  local_260._vptr_DB = local_208[0];
  local_208[0] = DVar1._vptr_DB;
  Status::~Status((Status *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x671);
  test::Tester::IsOk((Tester *)local_208,(Status *)&local_260);
  test::Tester::~Tester((Tester *)local_208);
  test::Tester::Tester
            ((Tester *)local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x672);
  test::Tester::Is((Tester *)local_208,local_258 != (DB *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)local_208);
  if (local_258 != (DB *)0x0) {
    (*local_258->_vptr_DB[1])();
  }
  local_258 = (DB *)0x0;
  Status::~Status((Status *)&local_260);
  std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

TEST(DBTest, DBOpen_Options) {
  std::string dbname = test::TmpDir() + "/db_options_test";
  DestroyDB(dbname, Options());

  // Does not exist, and create_if_missing == false: error
  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = false;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_TRUE(strstr(s.ToString().c_str(), "does not exist") != nullptr);
  ASSERT_TRUE(db == nullptr);

  // Does not exist, and create_if_missing == true: OK
  opts.create_if_missing = true;
  s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  // Does exist, and error_if_exists == true: error
  opts.create_if_missing = false;
  opts.error_if_exists = true;
  s = DB::Open(opts, dbname, &db);
  ASSERT_TRUE(strstr(s.ToString().c_str(), "exists") != nullptr);
  ASSERT_TRUE(db == nullptr);

  // Does exist, and error_if_exists == false: OK
  opts.create_if_missing = true;
  opts.error_if_exists = false;
  s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;
}